

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O0

bool __thiscall Web_Constraint::Is_Instance_Of(Web_Constraint *this,Am_Constraint *proto)

{
  uint uVar1;
  Am_Web_Data *local_30;
  Am_Web_Data *curr;
  Am_Web_Data *proto_data;
  Am_Constraint *proto_local;
  Web_Constraint *this_local;
  
  uVar1 = (**(proto->super_Am_Registered_Type)._vptr_Am_Registered_Type)();
  if ((uVar1 & 0xffff) == (uint)Am_Web_Data::id) {
    for (local_30 = this->owner; local_30 != (Am_Web_Data *)0x0; local_30 = local_30->prototype) {
      if (local_30 == (Am_Web_Data *)proto[1].super_Am_Registered_Type._vptr_Am_Registered_Type) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool
Web_Constraint::Is_Instance_Of(Am_Constraint *proto)
{
  if (proto->ID() == Am_Web_Data::id) {
    Am_Web_Data *proto_data = ((Web_Constraint *)proto)->owner;
    Am_Web_Data *curr;
    for (curr = owner; curr; curr = curr->prototype)
      if (curr == proto_data)
        return true;
  }
  return false;
}